

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

void __thiscall
despot::util::tinyxml::TiXmlDeclaration::Print
          (TiXmlDeclaration *this,FILE *cfile,int param_2,TiXmlString *str)

{
  Rep *pRVar1;
  
  if (cfile != (FILE *)0x0) {
    fwrite("<?xml ",6,1,(FILE *)cfile);
  }
  if (str != (TiXmlString *)0x0) {
    TiXmlString::append(str,"<?xml ",6);
  }
  pRVar1 = (this->version).rep_;
  if (pRVar1->size != 0) {
    if (cfile != (FILE *)0x0) {
      fprintf((FILE *)cfile,"version=\"%s\" ",pRVar1->str);
    }
    if (str != (TiXmlString *)0x0) {
      TiXmlString::append(str,"version=\"",9);
      pRVar1 = (this->version).rep_;
      TiXmlString::append(str,pRVar1->str,pRVar1->size);
      TiXmlString::append(str,"\" ",2);
    }
  }
  pRVar1 = (this->encoding).rep_;
  if (pRVar1->size != 0) {
    if (cfile != (FILE *)0x0) {
      fprintf((FILE *)cfile,"encoding=\"%s\" ",pRVar1->str);
    }
    if (str != (TiXmlString *)0x0) {
      TiXmlString::append(str,"encoding=\"",10);
      pRVar1 = (this->encoding).rep_;
      TiXmlString::append(str,pRVar1->str,pRVar1->size);
      TiXmlString::append(str,"\" ",2);
    }
  }
  pRVar1 = (this->standalone).rep_;
  if (pRVar1->size != 0) {
    if (cfile != (FILE *)0x0) {
      fprintf((FILE *)cfile,"standalone=\"%s\" ",pRVar1->str);
    }
    if (str != (TiXmlString *)0x0) {
      TiXmlString::append(str,"standalone=\"",0xc);
      pRVar1 = (this->standalone).rep_;
      TiXmlString::append(str,pRVar1->str,pRVar1->size);
      TiXmlString::append(str,"\" ",2);
    }
  }
  if (cfile != (FILE *)0x0) {
    fwrite("?>",2,1,(FILE *)cfile);
  }
  if (str != (TiXmlString *)0x0) {
    TiXmlString::append(str,"?>",2);
    return;
  }
  return;
}

Assistant:

void TiXmlDeclaration::Print(FILE* cfile, int /*depth*/,
	TIXML_STRING* str) const {
	if (cfile)
		fprintf(cfile, "<?xml ");
	if (str)
		(*str) += "<?xml ";

	if (!version.empty()) {
		if (cfile)
			fprintf(cfile, "version=\"%s\" ", version.c_str());
		if (str) {
			(*str) += "version=\"";
			(*str) += version;
			(*str) += "\" ";
		}
	}
	if (!encoding.empty()) {
		if (cfile)
			fprintf(cfile, "encoding=\"%s\" ", encoding.c_str());
		if (str) {
			(*str) += "encoding=\"";
			(*str) += encoding;
			(*str) += "\" ";
		}
	}
	if (!standalone.empty()) {
		if (cfile)
			fprintf(cfile, "standalone=\"%s\" ", standalone.c_str());
		if (str) {
			(*str) += "standalone=\"";
			(*str) += standalone;
			(*str) += "\" ";
		}
	}
	if (cfile)
		fprintf(cfile, "?>");
	if (str)
		(*str) += "?>";
}